

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O3

TA_RetCode
TA_SetInputParamPricePtr
          (TA_ParamHolder *param,uint paramIndex,TA_Real *open,TA_Real *high,TA_Real *low,
          TA_Real *close,TA_Real *volume,TA_Real *openInterest)

{
  int *piVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  TA_RetCode TVar5;
  long lVar6;
  
  if (param == (TA_ParamHolder *)0x0) {
    return TA_BAD_PARAM;
  }
  piVar1 = (int *)param->hiddenData;
  if (*piVar1 != -0x5dfd4dfe) {
    return TA_INVALID_PARAM_HOLDER;
  }
  if (*(long *)(piVar1 + 10) == 0) {
    return TA_INVALID_HANDLE;
  }
  if (paramIndex < *(uint *)(*(long *)(piVar1 + 10) + 0x24)) {
    lVar6 = (ulong)paramIndex * 0x38;
    piVar2 = *(int **)(*(long *)(piVar1 + 2) + 0x30 + lVar6);
    if (piVar2 == (int *)0x0) {
      return TA_INTERNAL_ERROR|TA_BAD_PARAM;
    }
    if (*piVar2 != 0) {
      return TA_INVALID_PARAM_HOLDER_TYPE;
    }
    uVar4 = piVar2[4];
    if ((uVar4 & 1) != 0) {
      if (open == (TA_Real *)0x0) goto LAB_00119f8f;
      *(TA_Real **)(*(long *)(piVar1 + 2) + lVar6) = open;
      uVar4 = piVar2[4];
    }
    if ((uVar4 & 2) != 0) {
      if (high == (TA_Real *)0x0) goto LAB_00119f8f;
      *(TA_Real **)(*(long *)(piVar1 + 2) + 8 + lVar6) = high;
      uVar4 = piVar2[4];
    }
    if ((uVar4 & 4) != 0) {
      if (low == (TA_Real *)0x0) goto LAB_00119f8f;
      *(TA_Real **)(*(long *)(piVar1 + 2) + 0x10 + lVar6) = low;
      uVar4 = piVar2[4];
    }
    if ((uVar4 & 8) != 0) {
      if (close == (TA_Real *)0x0) goto LAB_00119f8f;
      *(TA_Real **)(*(long *)(piVar1 + 2) + 0x18 + lVar6) = close;
      uVar4 = piVar2[4];
    }
    if ((uVar4 & 0x10) != 0) {
      if (volume == (TA_Real *)0x0) goto LAB_00119f8f;
      *(TA_Real **)(*(long *)(piVar1 + 2) + 0x20 + lVar6) = volume;
      uVar4 = piVar2[4];
    }
    if ((uVar4 & 0x20) != 0) {
      if (openInterest == (TA_Real *)0x0) {
        return TA_BAD_PARAM;
      }
      *(TA_Real **)(*(long *)(piVar1 + 2) + 0x28 + lVar6) = openInterest;
    }
    bVar3 = (byte)paramIndex & 0x1f;
    piVar1[8] = piVar1[8] & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
    TVar5 = TA_SUCCESS;
  }
  else {
LAB_00119f8f:
    TVar5 = TA_BAD_PARAM;
  }
  return TVar5;
}

Assistant:

TA_RetCode TA_SetInputParamPricePtr( TA_ParamHolder     *param,
                                     unsigned int        paramIndex,
                                     const TA_Real      *open,
                                     const TA_Real      *high,
                                     const TA_Real      *low,
                                     const TA_Real      *close,
                                     const TA_Real      *volume,
                                     const TA_Real      *openInterest )
{

   TA_ParamHolderPriv *paramHolderPriv;
   const TA_InputParameterInfo *paramInfo;
   const TA_FuncInfo *funcInfo;

   if( param == NULL )
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Make sure this index really exist. */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;
   if( paramIndex >= funcInfo->nbInput )
   {
      return TA_BAD_PARAM;
   }

   /* Verify the type of the parameter. */
   paramInfo = paramHolderPriv->in[paramIndex].inputInfo;
   if( !paramInfo ) return TA_INTERNAL_ERROR(2);
   if( paramInfo->type != TA_Input_Price )
   {
      return TA_INVALID_PARAM_HOLDER_TYPE;
   }

   /* keep a copy of the provided parameter. */
   #define SET_PARAM_INFO(lowerParam,upperParam) \
   { \
      if( paramInfo->flags & TA_IN_PRICE_##upperParam ) \
      { \
         if( lowerParam == NULL ) \
         { \
            return TA_BAD_PARAM; \
         } \
         paramHolderPriv->in[paramIndex].data.inPrice.lowerParam = lowerParam; \
      } \
   }

   SET_PARAM_INFO(open, OPEN );
   SET_PARAM_INFO(high, HIGH );
   SET_PARAM_INFO(low, LOW );
   SET_PARAM_INFO(close, CLOSE );
   SET_PARAM_INFO(volume, VOLUME );
   SET_PARAM_INFO(openInterest, OPENINTEREST );

   #undef SET_PARAM_INFO

   /* This parameter is now initialized, clear the corresponding bit. */
   paramHolderPriv->inBitmap &= ~(1<<paramIndex);

   return TA_SUCCESS;
}